

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O1

void av1_calculate_ref_frame_side(AV1_COMMON *cm)

{
  uint uVar1;
  SequenceHeader *pSVar2;
  int8_t iVar3;
  RefCntBuffer *pRVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  pSVar2 = cm->seq_params;
  cm->ref_frame_side[0] = '\0';
  cm->ref_frame_side[1] = '\0';
  cm->ref_frame_side[2] = '\0';
  cm->ref_frame_side[3] = '\0';
  cm->ref_frame_side[4] = '\0';
  cm->ref_frame_side[5] = '\0';
  cm->ref_frame_side[6] = '\0';
  cm->ref_frame_side[7] = '\0';
  if ((pSVar2->order_hint_info).enable_order_hint != 0) {
    uVar1 = cm->cur_frame->order_hint;
    lVar5 = 0;
    do {
      if ((long)cm->remapped_ref_idx[lVar5] == -1) {
        pRVar4 = (RefCntBuffer *)0x0;
      }
      else {
        pRVar4 = cm->ref_frame_map[cm->remapped_ref_idx[lVar5]];
      }
      if (pRVar4 == (RefCntBuffer *)0x0) {
        uVar6 = 0;
      }
      else {
        uVar6 = pRVar4->order_hint;
      }
      if ((((pSVar2->order_hint_info).enable_order_hint != 0) &&
          (uVar7 = uVar6 - uVar1,
          uVar8 = 1 << ((byte)(pSVar2->order_hint_info).order_hint_bits_minus_1 & 0x1f),
          iVar3 = '\x01', (int)(uVar8 & uVar7) < (int)(uVar8 - 1 & uVar7))) ||
         (iVar3 = -1, uVar6 == uVar1)) {
        cm->ref_frame_side[lVar5 + 1] = iVar3;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 7);
  }
  return;
}

Assistant:

void av1_calculate_ref_frame_side(AV1_COMMON *cm) {
  const OrderHintInfo *const order_hint_info = &cm->seq_params->order_hint_info;

  memset(cm->ref_frame_side, 0, sizeof(cm->ref_frame_side));
  if (!order_hint_info->enable_order_hint) return;

  const int cur_order_hint = cm->cur_frame->order_hint;

  for (int ref_frame = LAST_FRAME; ref_frame <= ALTREF_FRAME; ref_frame++) {
    const RefCntBuffer *const buf = get_ref_frame_buf(cm, ref_frame);
    int order_hint = 0;

    if (buf != NULL) order_hint = buf->order_hint;

    if (get_relative_dist(order_hint_info, order_hint, cur_order_hint) > 0)
      cm->ref_frame_side[ref_frame] = 1;
    else if (order_hint == cur_order_hint)
      cm->ref_frame_side[ref_frame] = -1;
  }
}